

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_verify
              (secp256k1_context *ctx,uchar *adaptor_sig162,secp256k1_pubkey *pubkey,uchar *msg32,
              secp256k1_pubkey *enckey)

{
  int iVar1;
  int iVar2;
  secp256k1_fe *rzr;
  undefined1 auVar3 [16];
  secp256k1_scalar u2;
  secp256k1_ge pubkey_ge;
  secp256k1_scalar sigr;
  secp256k1_scalar sp;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  secp256k1_ge rp;
  secp256k1_gej derived_rp;
  secp256k1_ge r;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_scalar msg;
  secp256k1_gej r1j;
  secp256k1_ge enckey_ge;
  secp256k1_gej pubkeyj;
  secp256k1_fe zr [8];
  secp256k1_ge r2;
  secp256k1_ge r1;
  secp256k1_scalar e_expected;
  secp256k1_scalar local_1118;
  secp256k1_gej local_10f8;
  secp256k1_scalar local_1070;
  secp256k1_scalar local_1050;
  secp256k1_scalar local_1030;
  secp256k1_scalar local_1010;
  secp256k1_ge local_ff0;
  secp256k1_gej local_f98;
  secp256k1_ge local_f18;
  secp256k1_strauss_state local_ec0;
  secp256k1_gej local_ea0;
  secp256k1_gej local_e20;
  secp256k1_gej local_da0;
  secp256k1_ge local_d20;
  secp256k1_gej local_cc8;
  secp256k1_fe local_c48 [8];
  secp256k1_gej local_b08 [8];
  secp256k1_strauss_point_state local_708;
  secp256k1_ge local_2f8 [8];
  
  iVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                    (&local_f18,&local_1070,&local_ff0,&local_1050,&local_1030,&local_1010,
                     adaptor_sig162);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = secp256k1_pubkey_load(ctx,&local_d20,enckey);
    iVar2 = 0;
    if (iVar1 != 0) {
      local_cc8.infinity = local_ff0.infinity;
      local_cc8.x.n[0] = local_ff0.x.n[0];
      local_cc8.x.n[1] = local_ff0.x.n[1];
      local_cc8.x.n[2] = local_ff0.x.n[2];
      local_cc8.x.n[3] = local_ff0.x.n[3];
      local_cc8.x.n[4] = local_ff0.x.n[4];
      local_cc8.y.n[0] = local_ff0.y.n[0];
      local_cc8.y.n[1] = local_ff0.y.n[1];
      local_cc8.y.n[2] = local_ff0.y.n[2];
      local_cc8.y.n[3] = local_ff0.y.n[3];
      local_cc8.y.n[4] = local_ff0.y.n[4];
      local_cc8.z.n[0] = 1;
      local_cc8.z.n[3] = 0;
      local_cc8.z.n[4] = 0;
      local_cc8.z.n[1] = 0;
      local_cc8.z.n[2] = 0;
      local_10f8.infinity = local_f18.infinity;
      local_10f8.x.n[4] = local_f18.x.n[4];
      local_10f8.x.n[2] = local_f18.x.n[2];
      local_10f8.x.n[3] = local_f18.x.n[3];
      local_10f8.x.n[0] = local_f18.x.n[0];
      local_10f8.x.n[1] = local_f18.x.n[1];
      local_10f8.y.n[4] = local_f18.y.n[4];
      local_10f8.y.n[2] = local_f18.y.n[2];
      local_10f8.y.n[3] = local_f18.y.n[3];
      local_10f8.y.n[0] = local_f18.y.n[0];
      local_10f8.y.n[1] = local_f18.y.n[1];
      local_10f8.z.n[0] = 1;
      local_10f8.z.n[3] = 0;
      local_10f8.z.n[4] = 0;
      local_10f8.z.n[1] = 0;
      local_10f8.z.n[2] = 0;
      secp256k1_scalar_negate(&local_1118,&local_1030);
      local_f98.x.n[0] = (uint64_t)local_b08;
      local_f98.x.n[1] = (uint64_t)local_c48;
      local_f98.x.n[2] = (uint64_t)local_2f8;
      local_f98.x.n[3] = (uint64_t)&local_708;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,(secp256k1_strauss_state *)&local_f98,&local_da0,1,&local_cc8,
                 &local_1118,&local_1010);
      local_f98.x.n[0] = (uint64_t)local_b08;
      local_f98.x.n[1] = (uint64_t)local_c48;
      local_f98.x.n[2] = (uint64_t)local_2f8;
      local_f98.x.n[3] = (uint64_t)&local_708;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,(secp256k1_strauss_state *)&local_f98,&local_ea0,1,&local_10f8,
                 &local_1118,&secp256k1_scalar_zero);
      local_f98.infinity = local_d20.infinity;
      local_f98.x.n[0] = local_d20.x.n[0];
      local_f98.x.n[1] = local_d20.x.n[1];
      local_f98.x.n[2] = local_d20.x.n[2];
      local_f98.x.n[3] = local_d20.x.n[3];
      local_f98.x.n[4] = local_d20.x.n[4];
      local_f98.y.n[0] = local_d20.y.n[0];
      local_f98.y.n[1] = local_d20.y.n[1];
      local_f98.y.n[2] = local_d20.y.n[2];
      local_f98.y.n[3] = local_d20.y.n[3];
      local_f98.y.n[4] = local_d20.y.n[4];
      local_f98.z.n[0] = 1;
      local_f98.z.n[3] = 0;
      local_f98.z.n[4] = 0;
      local_f98.z.n[1] = 0;
      local_f98.z.n[2] = 0;
      local_ec0.prej = local_b08;
      local_ec0.zr = local_c48;
      rzr = (secp256k1_fe *)0x1;
      local_ec0.pre_a = local_2f8;
      local_ec0.ps = &local_708;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,&local_ec0,&local_e20,1,&local_f98,&local_1010,
                 &secp256k1_scalar_zero);
      secp256k1_gej_add_var(&local_e20,&local_e20,&local_ea0,rzr);
      secp256k1_ge_set_gej((secp256k1_ge *)&local_708,&local_da0);
      secp256k1_ge_set_gej((secp256k1_ge *)local_b08,&local_e20);
      secp256k1_dleq_challenge
                ((secp256k1_scalar *)local_2f8,&local_d20,(secp256k1_ge *)&local_708,
                 (secp256k1_ge *)local_b08,&local_ff0,&local_f18);
      iVar2 = secp256k1_scalar_add
                        ((secp256k1_scalar *)local_2f8,(secp256k1_scalar *)local_2f8,&local_1118);
      auVar3._0_4_ = -(uint)((int)local_2f8[0].x.n[2] == 0 && (int)local_2f8[0].x.n[0] == 0);
      auVar3._4_4_ = -(uint)(local_2f8[0].x.n[2]._4_4_ == 0 && local_2f8[0].x.n[0]._4_4_ == 0);
      auVar3._8_4_ = -(uint)((int)local_2f8[0].x.n[3] == 0 && (int)local_2f8[0].x.n[1] == 0);
      auVar3._12_4_ = -(uint)(local_2f8[0].x.n[3]._4_4_ == 0 && local_2f8[0].x.n[1]._4_4_ == 0);
      iVar1 = movmskps(iVar2,auVar3);
      iVar2 = 0;
      if (iVar1 == 0xf) {
        secp256k1_scalar_set_b32((secp256k1_scalar *)&local_e20,msg32,(int *)0x0);
        iVar1 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)&local_10f8,pubkey);
        iVar2 = 0;
        if (iVar1 != 0) {
          secp256k1_scalar_inverse((secp256k1_scalar *)&local_ea0,&local_1050);
          secp256k1_scalar_mul
                    ((secp256k1_scalar *)&local_ec0,(secp256k1_scalar *)&local_ea0,
                     (secp256k1_scalar *)&local_e20);
          secp256k1_scalar_mul(&local_1118,(secp256k1_scalar *)&local_ea0,&local_1070);
          local_cc8.infinity = (int)local_10f8.z.n[0];
          local_cc8.x.n[0] = local_10f8.x.n[0];
          local_cc8.x.n[1] = local_10f8.x.n[1];
          local_cc8.x.n[2] = local_10f8.x.n[2];
          local_cc8.x.n[3] = local_10f8.x.n[3];
          local_cc8.x.n[4] = local_10f8.x.n[4];
          local_cc8.y.n[0] = local_10f8.y.n[0];
          local_cc8.y.n[1] = local_10f8.y.n[1];
          local_cc8.y.n[2] = local_10f8.y.n[2];
          local_cc8.y.n[3] = local_10f8.y.n[3];
          local_cc8.y.n[4] = local_10f8.y.n[4];
          local_cc8.z.n[0] = 1;
          local_cc8.z.n[1] = 0;
          local_cc8.z.n[2] = 0;
          local_cc8.z.n[3] = 0;
          local_cc8.z.n[4] = 0;
          local_da0.x.n[1] = (uint64_t)local_c48;
          local_da0.x.n[3] = (uint64_t)&local_708;
          local_da0.x.n[0] = (uint64_t)local_b08;
          local_da0.x.n[2] = (uint64_t)local_2f8;
          secp256k1_ecmult_strauss_wnaf
                    (&ctx->ecmult_ctx,(secp256k1_strauss_state *)&local_da0,&local_f98,1,&local_cc8,
                     &local_1118,(secp256k1_scalar *)&local_ec0);
          if (local_f98.infinity == 0) {
            secp256k1_gej_neg(&local_f98,&local_f98);
            secp256k1_gej_add_ge_var(&local_f98,&local_f98,&local_ff0,(secp256k1_fe *)0x0);
            iVar2 = local_f98.infinity;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_ecdsa_adaptor_verify(const secp256k1_context* ctx, const unsigned char *adaptor_sig162, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_pubkey *enckey) {
    secp256k1_scalar dleq_proof_s, dleq_proof_e;
    secp256k1_scalar msg;
    secp256k1_ge pubkey_ge;
    secp256k1_ge r, rp;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_ge enckey_ge;
    secp256k1_gej derived_rp;
    secp256k1_scalar sn, u1, u2;
    secp256k1_gej pubkeyj;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(enckey != NULL);

    if (!secp256k1_ecdsa_adaptor_sig_deserialize(&r, &sigr, &rp, &sp, &dleq_proof_e, &dleq_proof_s, adaptor_sig162)) {
        return 0;
    }
    if (!secp256k1_pubkey_load(ctx, &enckey_ge, enckey)) {
        return 0;
    }
    /* DLEQ_verify((R', Y, R), dleq_proof) */
    if(!secp256k1_dleq_verify(ctx, &dleq_proof_s, &dleq_proof_e, &rp, &enckey_ge, &r)) {
        return 0;
    }
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    if (!secp256k1_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    /* return R' == s'⁻¹(m * G + R.x * X) */
    secp256k1_scalar_inverse_var(&sn, &sp);
    secp256k1_scalar_mul(&u1, &sn, &msg);
    secp256k1_scalar_mul(&u2, &sn, &sigr);
    secp256k1_gej_set_ge(&pubkeyj, &pubkey_ge);
    secp256k1_ecmult(ctx, &derived_rp, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&derived_rp)) {
        return 0;
    }
    secp256k1_gej_neg(&derived_rp, &derived_rp);
    secp256k1_gej_add_ge_var(&derived_rp, &derived_rp, &rp, NULL);
    return secp256k1_gej_is_infinity(&derived_rp);
}